

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O2

string * __thiscall
tinyusdz::to_string_abi_cxx11_(string *__return_storage_ptr__,tinyusdz *this,Variability v)

{
  allocator *paVar1;
  int iVar2;
  char *pcVar3;
  allocator local_c;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  iVar2 = (int)this;
  if (iVar2 == 2) {
    pcVar3 = "config";
    paVar1 = &local_b;
  }
  else if (iVar2 == 1) {
    pcVar3 = "uniform";
    paVar1 = &local_a;
  }
  else if (iVar2 == 0) {
    pcVar3 = "varying";
    paVar1 = &local_9;
  }
  else {
    pcVar3 = "\"[[VariabilityInvalid]]\"";
    paVar1 = &local_c;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,paVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(tinyusdz::Variability v) {
  if (v == tinyusdz::Variability::Varying) {
    return "varying";
  } else if (v == tinyusdz::Variability::Uniform) {
    return "uniform";
  } else if (v == tinyusdz::Variability::Config) {
    return "config";
  } else {
    return "\"[[VariabilityInvalid]]\"";
  }
}